

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snp_vs_vcf.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  reference pbVar7;
  istream *piVar8;
  mapped_type *pmVar9;
  undefined1 *puVar10;
  size_type sVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  reference pvVar17;
  reference pvVar18;
  size_type sVar19;
  ostream *poVar20;
  char **in_RSI;
  int in_EDI;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint64_t i_2;
  set<int,_std::less<int>,_std::allocator<int>_> found_nonisolated;
  uint64_t i_1;
  set<int,_std::less<int>,_std::allocator<int>_> found;
  vector<call,_std::allocator<call>_> found_calls_vcf;
  bool found_1;
  uint64_t idx;
  __normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_> it;
  call c2;
  call c1;
  char ALT_1;
  char REF_1;
  string left_context2;
  string left_context1;
  string right_context2;
  string right_context1;
  string h2;
  string DNA2;
  string DNA1;
  int ipos;
  string pos_1;
  istringstream is_1;
  string h1;
  int non_isolated_SNPs;
  int last_id;
  string right_context;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  left_contexts;
  ifstream calls_file;
  vector<int,_std::allocator<int>_> assigned;
  uint64_t TN;
  uint64_t TP;
  uint64_t FN;
  uint64_t FP;
  uint64_t n_calls;
  int i;
  string left_context;
  string right_context_1;
  string ALT;
  string REF;
  string id;
  int pos;
  string chr;
  istringstream is;
  uint64_t ID;
  vector<call,_std::allocator<call>_> calls_vcf;
  ifstream vcf_file;
  uint64_t n_snps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> c_1;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  uint64_t N;
  char *c;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  int nonisolated_snps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  contigs;
  string contig;
  string line;
  ifstream ref_file;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ref;
  int opt;
  value_type *in_stack_ffffffffffffe728;
  call *in_stack_ffffffffffffe730;
  __normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_> in_stack_ffffffffffffe738;
  __normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_> in_stack_ffffffffffffe740;
  __normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_> in_stack_ffffffffffffe748;
  __normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_> in_stack_ffffffffffffe750;
  __normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_> in_stack_ffffffffffffe758;
  key_type *in_stack_ffffffffffffe768;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffe770;
  string *in_stack_ffffffffffffe788;
  string *in_stack_ffffffffffffe7a8;
  bool local_17d9;
  bool local_17a9;
  bool local_1661;
  int local_1488;
  int local_1484;
  ulong local_1430;
  ulong local_13e0;
  ulong local_1350;
  string local_1330 [32];
  string local_1310 [32];
  char local_12f0;
  char local_12ef;
  undefined8 local_12e8;
  undefined1 local_12e0;
  undefined4 local_12dc;
  string local_12d8 [32];
  string local_12b8 [32];
  char local_1298;
  char local_1297;
  undefined8 local_1290;
  undefined1 local_1288;
  undefined4 local_1284;
  char local_127a;
  char local_1279;
  string local_1278 [32];
  string local_1258 [32];
  string local_1238 [32];
  string local_1218 [32];
  string local_11f8 [32];
  string local_11d8 [32];
  string local_11b8 [32];
  string local_1198 [32];
  string local_1178 [36];
  int local_1154;
  istringstream local_1150 [384];
  istringstream local_fd0 [384];
  string local_e50 [32];
  string local_e30 [32];
  istringstream local_e10 [384];
  string local_c90 [32];
  int local_c70;
  undefined4 local_c6c;
  string local_c68 [64];
  string local_c28 [524];
  undefined4 local_a1c;
  vector<int,_std::allocator<int>_> local_a18;
  ulong local_a00;
  size_type local_9f8;
  ulong local_9f0;
  ulong local_9e8;
  long local_9e0;
  call *local_9d8;
  call *local_9d0;
  int local_9c4;
  string local_9c0 [32];
  string local_9a0 [32];
  char local_980;
  char local_97f;
  long local_978;
  undefined1 local_970;
  int local_96c;
  string local_968 [32];
  string local_948 [32];
  string local_928 [32];
  string local_908 [32];
  string local_8e8 [32];
  string local_8c8 [32];
  string local_8a8 [32];
  undefined1 local_888;
  undefined1 local_887;
  long local_880;
  undefined1 local_878;
  int local_874;
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [36];
  int local_7ac;
  string local_7a8 [32];
  istringstream local_788 [384];
  long local_608;
  vector<call,_std::allocator<call>_> local_600;
  string local_5e8 [520];
  long local_3e0;
  string local_3d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b0;
  undefined1 *local_3a8;
  long local_3a0;
  reference local_398;
  undefined8 local_390;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_388;
  string *local_380;
  string local_378 [32];
  string local_358 [36];
  int local_334;
  undefined1 local_330 [24];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [575];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  int local_14;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  if (in_EDI < 4) {
    help();
  }
  while (local_14 = getopt(local_8,local_10,"hv:c:f:l:k:"), pcVar13 = _optarg, local_14 != -1) {
    switch(local_14) {
    case 99:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,pcVar13,&local_71);
      std::__cxx11::string::operator=((string *)&calls_path_abi_cxx11_,local_70);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      break;
    default:
      help();
      return -1;
    case 0x66:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,pcVar13,&local_99);
      std::__cxx11::string::operator=((string *)&ref_path_abi_cxx11_,local_98);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      break;
    case 0x68:
      help();
      break;
    case 0x6b:
      k_nonis = atoi(_optarg);
      break;
    case 0x6c:
      rlength = atoi(_optarg);
      break;
    case 0x76:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,pcVar13,&local_39);
      std::__cxx11::string::operator=((string *)&vcf_path_abi_cxx11_,local_38);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
  }
  if (rlength == 0) {
    local_1484 = rlength_def;
  }
  else {
    local_1484 = rlength;
  }
  rlength = local_1484;
  if (k_nonis == 0) {
    local_1488 = k_nonis_def;
  }
  else {
    local_1488 = k_nonis;
  }
  k_nonis = local_1488;
  iVar5 = std::__cxx11::string::compare((char *)&vcf_path_abi_cxx11_);
  if (((iVar5 == 0) ||
      (iVar5 = std::__cxx11::string::compare((char *)&calls_path_abi_cxx11_), iVar5 == 0)) ||
     (iVar5 = std::__cxx11::string::compare((char *)&ref_path_abi_cxx11_), iVar5 == 0)) {
    help();
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x11028c);
  poVar6 = std::operator<<((ostream *)&std::cout,"Loading reference ... ");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  std::ifstream::ifstream(local_2d8);
  std::ifstream::open(local_2d8,0x11f2a8);
  std::__cxx11::string::string(local_2f8);
  std::__cxx11::string::string(local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x110310);
  local_334 = 0;
  while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_2d8,local_2f8);
    pcVar13 = (char *)std::__cxx11::string::operator[]((ulong)local_2f8);
    if (*pcVar13 == '>') {
      std::__cxx11::string::substr((ulong)local_358,(ulong)local_2f8);
      std::__cxx11::string::operator=(local_318,local_358);
      std::__cxx11::string::~string(local_358);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffe740._M_current,
                  &(in_stack_ffffffffffffe738._M_current)->right_context);
      std::__cxx11::string::string(local_378);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
      std::__cxx11::string::operator=((string *)pmVar9,local_378);
      std::__cxx11::string::~string(local_378);
    }
    else {
      local_380 = local_2f8;
      local_388._M_current = (char *)std::__cxx11::string::begin();
      local_390 = std::__cxx11::string::end();
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_ffffffffffffe730,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_ffffffffffffe728), bVar3) {
        local_398 = __gnu_cxx::
                    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&local_388);
        iVar5 = toupper((int)*local_398);
        *local_398 = (char)iVar5;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_388);
      }
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
      std::__cxx11::string::append((string *)pmVar9);
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"done.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_3a0 = 0;
  poVar6 = std::operator<<((ostream *)&std::cout,"Contig\tlength");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_3a8 = local_330;
  local_3b0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffe728);
  local_3b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffe728);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffe730,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffe728), bVar3) {
    pbVar7 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_3b0);
    std::__cxx11::string::string(local_3d8,(string *)pbVar7);
    poVar6 = std::operator<<((ostream *)&std::cout,local_3d8);
    poVar6 = std::operator<<(poVar6,"\t");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
    uVar12 = std::__cxx11::string::length();
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar12);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
    lVar14 = std::__cxx11::string::length();
    local_3a0 = lVar14 + local_3a0;
    std::__cxx11::string::~string(local_3d8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_3b0);
  }
  std::ifstream::close();
  poVar6 = std::operator<<((ostream *)&std::cout,"Loading VCF ... ");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  local_3e0 = 0;
  std::ifstream::ifstream(local_5e8);
  std::ifstream::open(local_5e8,0x11f268);
  std::vector<call,_std::allocator<call>_>::vector((vector<call,_std::allocator<call>_> *)0x11081e);
  local_608 = 0;
  while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_5e8,local_2f8);
    lVar14 = std::__cxx11::string::size();
    if ((lVar14 != 0) &&
       (pcVar13 = (char *)std::__cxx11::string::operator[]((ulong)local_2f8), *pcVar13 != '#')) {
      std::__cxx11::istringstream::istringstream(local_788,local_2f8,_S_in);
      std::__cxx11::string::string(local_7a8);
      std::__cxx11::string::string(local_7d0);
      std::__cxx11::string::string(local_7f0);
      std::__cxx11::string::string(local_810);
      piVar8 = std::operator>>((istream *)local_788,local_7a8);
      piVar8 = (istream *)std::istream::operator>>(piVar8,&local_7ac);
      piVar8 = std::operator>>(piVar8,local_7d0);
      piVar8 = std::operator>>(piVar8,local_7f0);
      std::operator>>(piVar8,local_810);
      local_7ac = local_7ac + -1;
      iVar5 = std::__cxx11::string::compare((char *)local_7f0);
      if ((((iVar5 == 0) ||
           ((iVar5 = std::__cxx11::string::compare((char *)local_7f0), iVar5 == 0 ||
            (iVar5 = std::__cxx11::string::compare((char *)local_7f0), iVar5 == 0)))) ||
          (iVar5 = std::__cxx11::string::compare((char *)local_7f0), iVar5 == 0)) &&
         ((((iVar5 = std::__cxx11::string::compare((char *)local_810), iVar5 == 0 ||
            (iVar5 = std::__cxx11::string::compare((char *)local_810), iVar5 == 0)) ||
           (iVar5 = std::__cxx11::string::compare((char *)local_810), iVar5 == 0)) ||
          (iVar5 = std::__cxx11::string::compare((char *)local_810), iVar5 == 0)))) {
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
        iVar5 = std::__cxx11::string::compare((char *)pmVar9);
        if (iVar5 == 0) {
          poVar6 = std::operator<<((ostream *)&std::cout,"WARNING: chromosome ");
          poVar6 = std::operator<<(poVar6,local_7a8);
          poVar6 = std::operator<<(poVar6," not found. ");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        else {
          local_3e0 = local_3e0 + 1;
          uVar12 = (ulong)local_7ac;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
          uVar16 = std::__cxx11::string::size();
          if (uVar16 <= uVar12) {
            poVar6 = std::operator<<((ostream *)&std::cout,"WARNING: position ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_7ac);
            poVar6 = std::operator<<(poVar6," larger than chromosome ");
            poVar6 = std::operator<<(poVar6,local_7a8);
            poVar6 = std::operator<<(poVar6,"\'s length ");
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
            uVar12 = std::__cxx11::string::size();
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar12);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          }
          if (rlength <= local_7ac) {
            iVar5 = local_7ac + rlength;
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
            uVar12 = std::__cxx11::string::size();
            if ((ulong)(long)iVar5 < uVar12) {
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
              std::__cxx11::string::substr((ulong)local_830,(ulong)pmVar9);
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
              std::__cxx11::string::substr((ulong)local_870,(ulong)pmVar9);
              REV(in_stack_ffffffffffffe788);
              std::__cxx11::string::~string(local_870);
              std::__cxx11::string::string(local_8c8,local_830);
              std::__cxx11::string::string(local_8a8,local_850);
              puVar10 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_7f0);
              local_888 = *puVar10;
              puVar10 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_810);
              local_887 = *puVar10;
              local_880 = local_608;
              local_878 = 1;
              local_874 = local_7ac;
              std::vector<call,_std::allocator<call>_>::push_back
                        ((vector<call,_std::allocator<call>_> *)in_stack_ffffffffffffe730,
                         in_stack_ffffffffffffe728);
              call::~call(in_stack_ffffffffffffe730);
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
              std::__cxx11::string::substr((ulong)local_928,(ulong)pmVar9);
              RC(in_stack_ffffffffffffe7a8);
              REV(in_stack_ffffffffffffe788);
              std::__cxx11::string::operator=(local_850,local_8e8);
              std::__cxx11::string::~string(local_8e8);
              std::__cxx11::string::~string(local_908);
              std::__cxx11::string::~string(local_928);
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
              std::__cxx11::string::substr((ulong)local_968,(ulong)pmVar9);
              RC(in_stack_ffffffffffffe7a8);
              std::__cxx11::string::operator=(local_830,local_948);
              std::__cxx11::string::~string(local_948);
              std::__cxx11::string::~string(local_968);
              std::__cxx11::string::string(local_9c0,local_830);
              std::__cxx11::string::string(local_9a0,local_850);
              pcVar13 = (char *)std::__cxx11::string::operator[]((ulong)local_7f0);
              local_980 = RC(*pcVar13);
              pcVar13 = (char *)std::__cxx11::string::operator[]((ulong)local_810);
              local_97f = RC(*pcVar13);
              local_978 = local_608;
              local_970 = 1;
              local_96c = local_7ac;
              std::vector<call,_std::allocator<call>_>::push_back
                        ((vector<call,_std::allocator<call>_> *)in_stack_ffffffffffffe730,
                         in_stack_ffffffffffffe728);
              call::~call(in_stack_ffffffffffffe730);
              std::__cxx11::string::~string(local_850);
              std::__cxx11::string::~string(local_830);
            }
          }
          local_608 = local_608 + 1;
        }
      }
      std::__cxx11::string::~string(local_810);
      std::__cxx11::string::~string(local_7f0);
      std::__cxx11::string::~string(local_7d0);
      std::__cxx11::string::~string(local_7a8);
      std::__cxx11::istringstream::~istringstream(local_788);
    }
  }
  sVar11 = std::vector<call,_std::allocator<call>_>::size(&local_600);
  if (sVar11 == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "WARNING: no variants found. Check that chromosome names are the same in the fasta and vcf files. "
                            );
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  local_9c4 = 2;
  while( true ) {
    sVar11 = std::vector<call,_std::allocator<call>_>::size(&local_600);
    bVar3 = false;
    if (1 < sVar11) {
      uVar12 = (ulong)local_9c4;
      sVar11 = std::vector<call,_std::allocator<call>_>::size(&local_600);
      bVar3 = uVar12 < sVar11 - 2;
    }
    if (!bVar3) break;
    if (local_9c4 % 2 == 0) {
      pvVar18 = std::vector<call,_std::allocator<call>_>::operator[](&local_600,(long)local_9c4);
      iVar5 = pvVar18->pos;
      pvVar18 = std::vector<call,_std::allocator<call>_>::operator[]
                          (&local_600,(long)(local_9c4 + -2));
      local_1661 = false;
      if (k_nonis <= iVar5 - pvVar18->pos) {
        pvVar18 = std::vector<call,_std::allocator<call>_>::operator[]
                            (&local_600,(long)(local_9c4 + 2));
        iVar5 = pvVar18->pos;
        pvVar18 = std::vector<call,_std::allocator<call>_>::operator[](&local_600,(long)local_9c4);
        local_1661 = k_nonis <= iVar5 - pvVar18->pos;
      }
      pvVar18 = std::vector<call,_std::allocator<call>_>::operator[](&local_600,(long)local_9c4);
      pvVar18->isolated = local_1661;
      pvVar18 = std::vector<call,_std::allocator<call>_>::operator[](&local_600,(long)local_9c4);
      bVar3 = pvVar18->isolated;
      pvVar18 = std::vector<call,_std::allocator<call>_>::operator[]
                          (&local_600,(long)(local_9c4 + 1));
      pvVar18->isolated = (bool)(bVar3 & 1);
      pvVar18 = std::vector<call,_std::allocator<call>_>::operator[](&local_600,(long)local_9c4);
      if ((pvVar18->isolated & 1U) == 0) {
        local_334 = local_334 + 1;
      }
    }
    local_9c4 = local_9c4 + 1;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"done.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Sorting VCF by context ... ");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  local_9d0 = (call *)std::vector<call,_std::allocator<call>_>::begin
                                ((vector<call,_std::allocator<call>_> *)in_stack_ffffffffffffe728);
  local_9d8 = (call *)std::vector<call,_std::allocator<call>_>::end
                                ((vector<call,_std::allocator<call>_> *)in_stack_ffffffffffffe728);
  std::
  sort<__gnu_cxx::__normal_iterator<call*,std::vector<call,std::allocator<call>>>,bool(*)(call_const&,call_const&)>
            (in_stack_ffffffffffffe750,in_stack_ffffffffffffe748,
             (_func_bool_call_ptr_call_ptr *)in_stack_ffffffffffffe740._M_current);
  poVar6 = std::operator<<((ostream *)&std::cout,"done.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::ifstream::close();
  local_9e0 = 0;
  poVar6 = std::operator<<((ostream *)&std::cout,"Checking calls ... ");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  local_9e8 = 0;
  local_9f0 = 0;
  local_9f8 = 0;
  local_a00 = 0;
  std::vector<call,_std::allocator<call>_>::size(&local_600);
  local_a1c = 0;
  std::allocator<int>::allocator((allocator<int> *)0x1117c6);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe750._M_current,
             (size_type)in_stack_ffffffffffffe748._M_current,
             (value_type_conflict1 *)in_stack_ffffffffffffe740._M_current,
             (allocator_type *)in_stack_ffffffffffffe738._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x1117fa);
  std::ifstream::ifstream(local_c28);
  std::ifstream::open(local_c28,0x11f288);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x111839);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe750._M_current,(size_type)in_stack_ffffffffffffe748._M_current,
           (allocator_type *)in_stack_ffffffffffffe740._M_current);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x111862);
  std::__cxx11::string::string(local_c68);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_c28,local_2f8);
  local_c6c = 0;
  local_c70 = 0;
  do {
    bVar2 = std::ios::eof();
    if (((bVar2 ^ 0xff) & 1) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"done.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::ifstream::close();
      std::vector<call,_std::allocator<call>_>::vector
                ((vector<call,_std::allocator<call>_> *)0x1129b3);
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1129c0);
      for (local_13e0 = 0; sVar11 = std::vector<call,_std::allocator<call>_>::size(&local_600),
          local_13e0 < sVar11; local_13e0 = local_13e0 + 1) {
        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[](&local_a18,local_13e0);
        if (*pvVar17 != 0) {
          std::vector<call,_std::allocator<call>_>::operator[](&local_600,local_13e0);
          std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     in_stack_ffffffffffffe750._M_current,
                     (value_type_conflict1 *)in_stack_ffffffffffffe748._M_current);
        }
      }
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x112abd);
      for (local_1430 = 0; sVar11 = std::vector<call,_std::allocator<call>_>::size(&local_600),
          local_1430 < sVar11; local_1430 = local_1430 + 1) {
        pvVar17 = std::vector<int,_std::allocator<int>_>::operator[](&local_a18,local_1430);
        if ((*pvVar17 != 0) &&
           (pvVar18 = std::vector<call,_std::allocator<call>_>::operator[](&local_600,local_1430),
           (pvVar18->isolated & 1U) == 0)) {
          std::vector<call,_std::allocator<call>_>::operator[](&local_600,local_1430);
          std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     in_stack_ffffffffffffe750._M_current,
                     (value_type_conflict1 *)in_stack_ffffffffffffe748._M_current);
        }
      }
      local_9f8 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x112bea);
      local_9f0 = local_3e0 - local_9f8;
      local_a00 = (local_3a0 - local_9e0) - local_9f0;
      poVar6 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,"Non-isolated SNPs detected: ");
      sVar19 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)0x112c7b);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar19);
      poVar6 = std::operator<<(poVar6,"/");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_334);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,"TP = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_9f8);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,"TN = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_a00);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,"FP = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_9e8);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,"FN = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_9f0);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,"sensitivity = TP/(TP+FN) = ");
      auVar22._8_4_ = (int)(local_9f8 >> 0x20);
      auVar22._0_8_ = local_9f8;
      auVar22._12_4_ = 0x45300000;
      dVar21 = (auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_9f8) - 4503599627370496.0);
      auVar25._8_4_ = (int)(local_9f0 >> 0x20);
      auVar25._0_8_ = local_9f0;
      auVar25._12_4_ = 0x45300000;
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(dVar21 * 100.0) /
                                 (dVar21 + (auVar25._8_8_ - 1.9342813113834067e+25) +
                                           ((double)CONCAT44(0x43300000,(int)local_9f0) -
                                           4503599627370496.0)));
      poVar6 = std::operator<<(poVar6,"%");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,"specificity = TN/(TN+FP) = ");
      auVar23._8_4_ = (int)(local_a00 >> 0x20);
      auVar23._0_8_ = local_a00;
      auVar23._12_4_ = 0x45300000;
      dVar21 = (auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_a00) - 4503599627370496.0);
      auVar26._8_4_ = (int)(local_9e8 >> 0x20);
      auVar26._0_8_ = local_9e8;
      auVar26._12_4_ = 0x45300000;
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(dVar21 * 100.0) /
                                 (dVar21 + (auVar26._8_8_ - 1.9342813113834067e+25) +
                                           ((double)CONCAT44(0x43300000,(int)local_9e8) -
                                           4503599627370496.0)));
      poVar6 = std::operator<<(poVar6,"%");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar20 = std::operator<<((ostream *)&std::cout,"precision   = TP/(TP+FP) = ");
      auVar24._8_4_ = (int)(local_9f8 >> 0x20);
      auVar24._0_8_ = local_9f8;
      auVar24._12_4_ = 0x45300000;
      dVar21 = (auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_9f8) - 4503599627370496.0);
      auVar27._8_4_ = (int)(local_9e8 >> 0x20);
      auVar27._0_8_ = local_9e8;
      auVar27._12_4_ = 0x45300000;
      poVar20 = (ostream *)
                std::ostream::operator<<
                          (poVar20,(dVar21 * 100.0) /
                                   (dVar21 + (auVar27._8_8_ - 1.9342813113834067e+25) +
                                             ((double)CONCAT44(0x43300000,(int)local_9e8) -
                                             4503599627370496.0)));
      poVar20 = std::operator<<(poVar20,"%");
      std::ostream::operator<<(poVar20,std::endl<char,std::char_traits<char>>);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x113041);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x11304e);
      std::vector<call,_std::allocator<call>_>::~vector
                ((vector<call,_std::allocator<call>_> *)poVar6);
      std::__cxx11::string::~string(local_c68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)poVar6);
      std::ifstream::~ifstream(local_c28);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)poVar6);
      std::vector<call,_std::allocator<call>_>::~vector
                ((vector<call,_std::allocator<call>_> *)poVar6);
      std::ifstream::~ifstream(local_5e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)poVar6);
      std::__cxx11::string::~string(local_318);
      std::__cxx11::string::~string(local_2f8);
      std::ifstream::~ifstream(local_2d8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x1130ea);
      return local_4;
    }
    std::__cxx11::string::string(local_c90,local_2f8);
    std::__cxx11::istringstream::istringstream(local_e10,local_2f8,_S_in);
    std::__cxx11::string::string(local_e30);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_e10,local_e30,'|');
    std::__cxx11::string::substr((ulong)local_e50,(ulong)local_e30);
    iVar5 = std::__cxx11::string::compare((char *)local_e50);
    std::__cxx11::string::~string(local_e50);
    if (iVar5 == 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_e10,local_e30,'|');
      std::__cxx11::istringstream::istringstream(local_fd0,local_e30,_S_in);
      std::__cxx11::istringstream::operator=(local_e10,local_fd0);
      std::__cxx11::istringstream::~istringstream(local_fd0);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_e10,local_e30,':');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_e10,local_e30,':');
      std::__cxx11::istringstream::istringstream(local_1150,local_e30,_S_in);
      std::__cxx11::istringstream::operator=(local_e10,local_1150);
      std::__cxx11::istringstream::~istringstream(local_1150);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_e10,local_e30,'_');
      pcVar13 = (char *)std::__cxx11::string::c_str();
      atoi(pcVar13);
      local_1154 = 0;
      std::__cxx11::string::string(local_1178);
      std::__cxx11::string::string(local_1198);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_c28,local_1178);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_c28,local_1198);
      std::__cxx11::string::string(local_11b8,local_1198);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_c28,local_1198);
      lVar14 = std::__cxx11::string::length();
      lVar15 = std::__cxx11::string::length();
      if (lVar14 != lVar15) {
        std::operator<<((ostream *)&std::cout,
                        "Error: malformed SNP file. Two reads with different length in a SNP:\n");
        poVar6 = std::operator<<((ostream *)&std::cout,local_c90);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,local_1178);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,local_11b8);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,local_1198);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      for (; uVar12 = (ulong)local_1154, uVar16 = std::__cxx11::string::size(), uVar12 < uVar16;
          local_1154 = local_1154 + 1) {
        std::__cxx11::string::size();
        pcVar13 = (char *)std::__cxx11::string::operator[]((ulong)local_1178);
        cVar1 = *pcVar13;
        std::__cxx11::string::size();
        pcVar13 = (char *)std::__cxx11::string::operator[]((ulong)local_1198);
        if (cVar1 != *pcVar13) {
          local_9e0 = local_9e0 + 1;
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_11d8,(ulong)local_1178);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_11f8,(ulong)local_1198);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_1238,(ulong)local_1178);
          REV(in_stack_ffffffffffffe788);
          std::__cxx11::string::~string(local_1238);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_1278,(ulong)local_1198);
          REV(in_stack_ffffffffffffe788);
          std::__cxx11::string::~string(local_1278);
          std::__cxx11::string::size();
          pcVar13 = (char *)std::__cxx11::string::operator[]((ulong)local_1178);
          local_1279 = *pcVar13;
          std::__cxx11::string::size();
          pcVar13 = (char *)std::__cxx11::string::operator[]((ulong)local_1198);
          local_127a = *pcVar13;
          std::__cxx11::string::string(local_12d8,local_11d8);
          std::__cxx11::string::string(local_12b8,local_1218);
          local_1298 = local_1279;
          local_1297 = local_127a;
          local_1290 = 0;
          local_1288 = 0;
          local_1284 = 0;
          std::__cxx11::string::string(local_1330,local_11f8);
          std::__cxx11::string::string(local_1310,local_1258);
          local_12f0 = local_1279;
          local_12ef = local_127a;
          local_12e8 = 0;
          local_12e0 = 0;
          local_12dc = 0;
          local_c70 = local_c70 + 1;
          std::vector<call,_std::allocator<call>_>::begin
                    ((vector<call,_std::allocator<call>_> *)in_stack_ffffffffffffe728);
          std::vector<call,_std::allocator<call>_>::end
                    ((vector<call,_std::allocator<call>_> *)in_stack_ffffffffffffe728);
          std::
          lower_bound<__gnu_cxx::__normal_iterator<call*,std::vector<call,std::allocator<call>>>,call,bool(*)(call_const&,call_const&)>
                    (in_stack_ffffffffffffe758,in_stack_ffffffffffffe750,
                     in_stack_ffffffffffffe748._M_current,
                     (_func_bool_call_ptr_call_ptr *)in_stack_ffffffffffffe740._M_current);
          std::vector<call,_std::allocator<call>_>::begin
                    ((vector<call,_std::allocator<call>_> *)in_stack_ffffffffffffe728);
          local_1350 = std::
                       distance<__gnu_cxx::__normal_iterator<call*,std::vector<call,std::allocator<call>>>>
                                 (in_stack_ffffffffffffe740,in_stack_ffffffffffffe738);
          bVar3 = false;
          while( true ) {
            sVar11 = std::vector<call,_std::allocator<call>_>::size(&local_600);
            local_17a9 = false;
            if (local_1350 < sVar11) {
              std::vector<call,_std::allocator<call>_>::operator[](&local_600,local_1350);
              local_17a9 = is_prefix(&(in_stack_ffffffffffffe748._M_current)->right_context,
                                     &(in_stack_ffffffffffffe740._M_current)->right_context);
            }
            if (local_17a9 == false) break;
            pvVar18 = std::vector<call,_std::allocator<call>_>::operator[](&local_600,local_1350);
            if (((pvVar18->ALT == local_127a) &&
                (pvVar18 = std::vector<call,_std::allocator<call>_>::operator[]
                                     (&local_600,local_1350), pvVar18->REF == local_1279)) ||
               ((pvVar18 = std::vector<call,_std::allocator<call>_>::operator[]
                                     (&local_600,local_1350), pvVar18->ALT == local_1279 &&
                (pvVar18 = std::vector<call,_std::allocator<call>_>::operator[]
                                     (&local_600,local_1350), pvVar18->REF == local_127a)))) {
              std::vector<call,_std::allocator<call>_>::operator[](&local_600,local_1350);
              bVar4 = is_prefix(&(in_stack_ffffffffffffe748._M_current)->right_context,
                                &(in_stack_ffffffffffffe740._M_current)->right_context);
              if (bVar4) {
                bVar3 = true;
                pvVar17 = std::vector<int,_std::allocator<int>_>::operator[](&local_a18,local_1350);
                *pvVar17 = 1;
              }
            }
            local_1350 = local_1350 + 1;
          }
          if (!bVar3) {
            std::vector<call,_std::allocator<call>_>::begin
                      ((vector<call,_std::allocator<call>_> *)in_stack_ffffffffffffe728);
            std::vector<call,_std::allocator<call>_>::end
                      ((vector<call,_std::allocator<call>_> *)in_stack_ffffffffffffe728);
            std::
            lower_bound<__gnu_cxx::__normal_iterator<call*,std::vector<call,std::allocator<call>>>,call,bool(*)(call_const&,call_const&)>
                      (in_stack_ffffffffffffe758,in_stack_ffffffffffffe750,
                       in_stack_ffffffffffffe748._M_current,
                       (_func_bool_call_ptr_call_ptr *)in_stack_ffffffffffffe740._M_current);
            std::vector<call,_std::allocator<call>_>::begin
                      ((vector<call,_std::allocator<call>_> *)in_stack_ffffffffffffe728);
            local_1350 = std::
                         distance<__gnu_cxx::__normal_iterator<call*,std::vector<call,std::allocator<call>>>>
                                   (in_stack_ffffffffffffe740,in_stack_ffffffffffffe738);
            while( true ) {
              sVar11 = std::vector<call,_std::allocator<call>_>::size(&local_600);
              local_17d9 = false;
              if (local_1350 < sVar11) {
                std::vector<call,_std::allocator<call>_>::operator[](&local_600,local_1350);
                local_17d9 = is_prefix(&(in_stack_ffffffffffffe748._M_current)->right_context,
                                       &(in_stack_ffffffffffffe740._M_current)->right_context);
              }
              if (local_17d9 == false) break;
              pvVar18 = std::vector<call,_std::allocator<call>_>::operator[](&local_600,local_1350);
              if (((pvVar18->ALT == local_127a) &&
                  (pvVar18 = std::vector<call,_std::allocator<call>_>::operator[]
                                       (&local_600,local_1350), pvVar18->REF == local_1279)) ||
                 ((pvVar18 = std::vector<call,_std::allocator<call>_>::operator[]
                                       (&local_600,local_1350), pvVar18->ALT == local_1279 &&
                  (pvVar18 = std::vector<call,_std::allocator<call>_>::operator[]
                                       (&local_600,local_1350), pvVar18->REF == local_127a)))) {
                std::vector<call,_std::allocator<call>_>::operator[](&local_600,local_1350);
                bVar4 = is_prefix(&(in_stack_ffffffffffffe748._M_current)->right_context,
                                  &(in_stack_ffffffffffffe740._M_current)->right_context);
                if (bVar4) {
                  bVar3 = true;
                  pvVar17 = std::vector<int,_std::allocator<int>_>::operator[]
                                      (&local_a18,local_1350);
                  *pvVar17 = 1;
                }
              }
              local_1350 = local_1350 + 1;
            }
          }
          if (!bVar3) {
            local_9e8 = local_9e8 + 1;
          }
          call::~call(in_stack_ffffffffffffe730);
          call::~call(in_stack_ffffffffffffe730);
          std::__cxx11::string::~string(local_1258);
          std::__cxx11::string::~string(local_1218);
          std::__cxx11::string::~string(local_11f8);
          std::__cxx11::string::~string(local_11d8);
        }
      }
      local_c70 = local_c70 + -1;
      std::__cxx11::string::~string(local_11b8);
      std::__cxx11::string::~string(local_1198);
      std::__cxx11::string::~string(local_1178);
    }
    else {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_c28,local_2f8)
      ;
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_c28,local_2f8)
      ;
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_c28,local_2f8)
      ;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_c28,local_2f8);
    std::__cxx11::string::~string(local_e30);
    std::__cxx11::istringstream::~istringstream(local_e10);
    std::__cxx11::string::~string(local_c90);
  } while( true );
}

Assistant:

int main(int argc, char** argv){

	if(argc < 4) help();

	int opt;
	while ((opt = getopt(argc, argv, "hv:c:f:l:k:")) != -1){
		switch (opt){
			case 'h':
				help();
			break;
			case 'v':
				vcf_path = string(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'c':
				calls_path = string(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'f':
				ref_path = string(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'l':
				rlength = atoi(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'k':
				k_nonis = atoi(optarg);
				//cout << "input = " << input << "\n";
			break;
			default:
				help();
			return -1;
		}
	}

	rlength = rlength == 0 ? rlength_def : rlength;
	k_nonis = k_nonis == 0 ? k_nonis_def : k_nonis;

	if(vcf_path.compare("")==0 or calls_path.compare("")==0 or ref_path.compare("")==0) help();

	//reference indexed by contig: e.g. string chr1 = ref["chr1"]
	std::map<string,string> ref;

	cout << "Loading reference ... " << flush;

	/*
	 *
	 * READ REFERENCE, LOAD CONTIGS IN MEMORY
	 *
	 */
	ifstream ref_file;
	ref_file.open(ref_path, ios::in);

	string line;
	string contig;

	vector<string> contigs;

	int nonisolated_snps=0;

	while(not ref_file.eof()){

		getline(ref_file, line);

		if(line[0] == '>'){//new contig name

			contig = line.substr(1);
			contigs.push_back(contig);

			ref[contig] = string();

		}else{

			for (auto & c: line) c = toupper(c);
			ref[contig].append(line);

		}

	}

	cout << "done." << endl;

	uint64_t N = 0;

	cout << "Contig\tlength" << endl;
	for(auto c : contigs){

		cout << c << "\t" << ref[c].length() << endl;

		N+=ref[c].length();

	}
	//cout << endl;

	ref_file.close();


	/*
	 * LOAD SNPS FROM VCF
	 */

	cout << "Loading VCF ... " << flush;

	uint64_t n_snps=0;//number of SNPs in the VCF

	//read vcf
	ifstream vcf_file;
	vcf_file.open(vcf_path, ios::in);

	vector<call> calls_vcf;
	uint64_t ID = 0;

	while(not vcf_file.eof()){

		getline(vcf_file, line);

		if(line.size()>0 and line[0] != '#'){

			std::istringstream is( line );

			string chr;
			int pos;
			string id;
			string REF;
			string ALT;

			is >> chr >> pos >> id >> REF >> ALT;

			pos--;//coordinates are 1-based in the vcf file

			//keep just SNPs
			if(		(REF.compare("A")==0 or REF.compare("C")==0 or REF.compare("T")==0 or REF.compare("G")==0) and
					(ALT.compare("A")==0 or ALT.compare("C")==0 or ALT.compare("T")==0 or ALT.compare("G")==0)
			){

				if(ref[chr].compare("")!=0){//if chromosome exists in the reference file

					n_snps++;

					//insert forward call

					if(pos >= ref[chr].size()){

						cout << "WARNING: position " << pos << " larger than chromosome " << chr << "'s length " << ref[chr].size() << endl;

					}

					if(pos >= rlength && pos+rlength < ref[chr].size()){

						assert(pos+1<ref[chr].size());
						assert(pos+1+rlength<=ref[chr].size());
						assert(pos>=rlength);
						assert(pos-rlength<ref[chr].size());
						assert(pos<=ref[chr].size());

						string right_context = ref[chr].substr(pos+1,rlength);
						string left_context = REV(ref[chr].substr(pos-rlength,rlength));

						assert(REF.size()>0);
						assert(ALT.size()>0);

						calls_vcf.push_back(call {right_context, left_context, REF[0], ALT[0], ID, true, pos});

						//insert RC call

						left_context = REV(RC(ref[chr].substr(pos+1,rlength)));
						right_context = RC(ref[chr].substr(pos-rlength,rlength));

						calls_vcf.push_back(call {right_context, left_context, RC(REF[0]), RC(ALT[0]), ID, true, pos});

					}

					++ID;

				}else{

					cout << "WARNING: chromosome " << chr << " not found. " << endl;

				}

			}

		}

	}


	if(calls_vcf.size()==0){

		cout << "WARNING: no variants found. Check that chromosome names are the same in the fasta and vcf files. " << endl;

	}

	for(int i=2;calls_vcf.size() > 1 && i<calls_vcf.size()-2;++i){

		if(i%2==0){

			calls_vcf[i].isolated = calls_vcf[i].pos - calls_vcf[i-2].pos >= k_nonis and calls_vcf[i+2].pos - calls_vcf[i].pos >= k_nonis;
			calls_vcf[i+1].isolated = calls_vcf[i].isolated;

			if(not calls_vcf[i].isolated){

				//cout << calls_vcf[i].pos - calls_vcf[i-2].pos << " " << calls_vcf[i+2].pos - calls_vcf[i].pos << endl;
				nonisolated_snps++;

			}

		}

	}

	cout << "done." << endl;

	cout << "Sorting VCF by context ... " << flush;
	std::sort(calls_vcf.begin(), calls_vcf.end(), comp);
	cout << "done." << endl;

	vcf_file.close();

	//vector<call> calls;

	/*
	 *
	 * LOAD CALLS FROM FASTA GENERATED BY SNP-CALLING TOOL, SEARCH THEM IN THE RANGE STRUCTURE OF
	 * CONTAINING VCF CALLS
	 *
	 */

	uint64_t n_calls = 0;//number of SNPs in input fasta file (including hidden SNPs inside the sequences)

	cout << "Checking calls ... " << flush;

	uint64_t FP = 0;
	uint64_t FN = 0;
	uint64_t TP = 0;
	uint64_t TN = 0;

	auto assigned = vector<int>(calls_vcf.size(),0);

	//read calls
	ifstream calls_file;
	calls_file.open(calls_path, ios::in);

	//left/right contexts per sample
	vector<string> left_contexts = vector<string>(2);
	string right_context;

	getline(calls_file, line);

	int last_id = 0;
	int non_isolated_SNPs = 0;

	while(not calls_file.eof()){

		//header of first read

		string h1=line;

		std::istringstream is( line );
		string pos;
		getline(is,pos,'|');

		if(pos.substr(0,4).compare(">SNP")==0){//filter out indels

			getline(is,pos,'|');

			is = istringstream(pos);
			getline(is,pos,':');
			getline(is,pos,':');

			is = istringstream(pos);
			getline(is,pos,'_');

			int ipos = atoi(pos.c_str());//position of leftmost SNP
			ipos = 0;

			string DNA1, DNA2;
			getline(calls_file, DNA1);//DNA of first read

			getline(calls_file, DNA2);//skip header of second read
			string h2=DNA2;

			getline(calls_file, DNA2);//DNA of second read

			//some consistency checks on the file

			/*if(DNA1.substr(DNA1.size() - ipos).compare(DNA2.substr(DNA2.size() - ipos)) != 0){

				cout << "Error: malformed SNP file. Last " << ipos << " bases do not coincide\n";
				cout << h1 << endl << DNA1 << endl << h2 << endl << DNA2 << endl;
				exit(1);

			}*/

			if(DNA1.length()!=DNA2.length()){

				cout << "Error: malformed SNP file. Two reads with different length in a SNP:\n";
				cout << h1 << endl << DNA1 << endl << h2 << endl << DNA2 << endl;
				exit(1);

			}

			/*if(DNA1[DNA1.size()-ipos-1] == DNA2[DNA2.size()-ipos-1]){

				cout << "Error: malformed SNP file. No SNP at specified position:\n";
				cout << h1 << endl << DNA1 << endl << h2 << endl << DNA2 << endl;
				exit(1);

			}*/

			//search all SNPs from the leftmost backwards
			while(ipos<DNA1.size()){

				//if SNP found
				if(DNA1[DNA1.size()-ipos-1] != DNA2[DNA2.size()-ipos-1]){

					n_calls++;

					string right_context1 = DNA1.substr(DNA1.size()-ipos);
					string right_context2 = DNA2.substr(DNA2.size()-ipos);

					string left_context1 = REV(DNA1.substr(0, DNA1.size()-ipos-1));
					string left_context2 = REV(DNA2.substr(0, DNA2.size()-ipos-1));

					char REF = DNA1[DNA1.size()-ipos-1];
					char ALT = DNA2[DNA2.size()-ipos-1];

					call c1 = {right_context1, left_context1, REF, ALT, 0, false};
					call c2 = {right_context2, left_context2, REF, ALT, 0, false};

					non_isolated_SNPs++;

					//Search c1 in the range structure

					auto it = lower_bound(calls_vcf.begin(), calls_vcf.end(),c1, comp);

					uint64_t idx = std::distance(calls_vcf.begin(), it);

					bool found = false;

					/*
					 * while right context of c1 prefixes right context in range of VCF calls
					 */

					while(idx < calls_vcf.size() and is_prefix(right_context1, calls_vcf[idx].right_context)){

						if( ((calls_vcf[idx].ALT == ALT and calls_vcf[idx].REF == REF) or (calls_vcf[idx].ALT == REF and calls_vcf[idx].REF == ALT)) and
							(is_prefix(left_context1, calls_vcf[idx].left_context))	){

							found = true;
							assigned[idx] = 1;

						}

						++idx;

					}

					if(not found){

						//Search c2 in the range structure

						it = lower_bound(calls_vcf.begin(), calls_vcf.end(),c2, comp);

						idx = std::distance(calls_vcf.begin(), it);

						/*
						 * while right context of c2 prefixes right context in range of VCF calls
						 */
						while(idx < calls_vcf.size() and is_prefix(right_context2, calls_vcf[idx].right_context)){

							if( ((calls_vcf[idx].ALT == ALT and calls_vcf[idx].REF == REF) or (calls_vcf[idx].ALT == REF and calls_vcf[idx].REF == ALT)) and
								(is_prefix(left_context2, calls_vcf[idx].left_context))	){

								found = true;
								assigned[idx] = 1;

							}

							++idx;

						}

					}

					if(not found) FP++;

				}

				++ipos;

			}

			non_isolated_SNPs--;

		}else{

			//skip event

			getline(calls_file, line);//DNA of first read
			getline(calls_file, line);//header of second read
			getline(calls_file, line);//DNA of second read

		}

		getline(calls_file, line);//header of first read

	}

	cout << "done." << endl;

	calls_file.close();



	vector<call> found_calls_vcf;//count how many SNPs in the VCF have been found

	std::set<int> found;

	for (uint64_t i = 0; i< calls_vcf.size();++i){

		if(assigned[i]){

			found.insert(calls_vcf[i].ID);

		}

	}

	//nonisolated SNPs found
	std::set<int> found_nonisolated;

	for (uint64_t i = 0; i< calls_vcf.size();++i){

		if(assigned[i] and not calls_vcf[i].isolated){

			found_nonisolated.insert(calls_vcf[i].ID);

		}

	}

	TP = found.size();

	//number of true SNPs that are not found
	FN = n_snps - TP;

	//this is a lower bound because we may call multiple times the same SNP
	TN = (N - n_calls) -  FN;

	cout << endl << "Non-isolated SNPs detected: " << found_nonisolated.size()  << "/" << nonisolated_snps << endl;

	cout << endl;
	cout << "TP = " << TP << endl;
	cout << "TN = " << TN << endl;
	cout << "FP = " << FP << endl;
	cout << "FN = " << FN << endl;

	cout << "sensitivity = TP/(TP+FN) = " << 100*double(TP)/(double(TP)+double(FN)) << "%" << endl;
	cout << "specificity = TN/(TN+FP) = " << 100*double(TN)/(double(TN)+double(FP)) << "%" << endl;
	cout << "precision   = TP/(TP+FP) = " << 100*double(TP)/(double(TP)+double(FP)) << "%" << endl;



}